

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O0

void FileHdrWrapper::initCharact(void)

{
  size_type sVar1;
  mapped_type *pmVar2;
  key_type_conflict2 local_44 [15];
  
  sVar1 = std::
          map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
          ::size(&s_fHdrCharact);
  if (sVar1 == 0) {
    local_44[0xe] = 1;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 0xe);
    QString::operator=(pmVar2,"Relocation info stripped from file.");
    local_44[0xd] = 2;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 0xd);
    QString::operator=(pmVar2,"File is executable  (i.e. no unresolved external references).");
    local_44[0xc] = 4;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 0xc);
    QString::operator=(pmVar2,"Line numbers stripped from file.");
    local_44[0xb] = 8;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 0xb);
    QString::operator=(pmVar2,"Local symbols stripped from file.");
    local_44[10] = 0x10;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 10);
    QString::operator=(pmVar2,"Aggressively trim working set");
    local_44[9] = 0x20;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 9);
    QString::operator=(pmVar2,"App can handle >2gb addresses");
    local_44[8] = 0x80;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 8);
    QString::operator=(pmVar2,"Bytes of machine word are reversed.");
    local_44[7] = 0x100;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 7);
    QString::operator=(pmVar2,"32 bit word machine.");
    local_44[6] = 0x200;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 6);
    QString::operator=(pmVar2,"Debugging info stripped from file in .DBG file");
    local_44[5] = 0x400;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 5);
    QString::operator=(pmVar2,"If Image is on removable media, copy and run from the swap file.");
    local_44[4] = 0x800;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 4);
    QString::operator=(pmVar2,"If Image is on Net, copy and run from the swap file.");
    local_44[3] = 0x1000;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 3);
    QString::operator=(pmVar2,"System File.");
    local_44[2] = 0x2000;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 2);
    QString::operator=(pmVar2,"File is a DLL.");
    local_44[1] = 0x4000;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44 + 1);
    QString::operator=(pmVar2,"File should only be run on a UP machine");
    local_44[0] = 0x8000;
    pmVar2 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_fHdrCharact,local_44);
    QString::operator=(pmVar2,"Bytes of machine word are reversed.");
  }
  return;
}

Assistant:

void FileHdrWrapper::initCharact()
{
    if (s_fHdrCharact.size() != 0) {
        return; //already initialized
    }
    s_fHdrCharact[F_RELOCS_STRIPPED] = "Relocation info stripped from file.";
    s_fHdrCharact[F_EXECUTABLE_IMAGE] = "File is executable  (i.e. no unresolved external references).";
    s_fHdrCharact[F_LINE_NUMS_STRIPPED] = "Line numbers stripped from file.";
    s_fHdrCharact[F_LOCAL_SYMS_STRIPPED] = "Local symbols stripped from file.";
    s_fHdrCharact[F_AGGRESIVE_WS_TRIM] = "Aggressively trim working set";
    s_fHdrCharact[F_LARGE_ADDRESS_AWARE] = "App can handle >2gb addresses";
    s_fHdrCharact[F_BYTES_REVERSED_LO] = "Bytes of machine word are reversed.";
    s_fHdrCharact[F_MACHINE_32BIT] = "32 bit word machine.";
    s_fHdrCharact[F_DEBUG_STRIPPED] = "Debugging info stripped from file in .DBG file";
    s_fHdrCharact[F_REMOVABLE_RUN_FROM_SWAP] = "If Image is on removable media, copy and run from the swap file.";
    s_fHdrCharact[F_NET_RUN_FROM_SWAP] = "If Image is on Net, copy and run from the swap file.";
    s_fHdrCharact[F_SYSTEM] = "System File.";
    s_fHdrCharact[F_DLL] = "File is a DLL.";
    s_fHdrCharact[F_UP_SYSTEM_ONLY] = "File should only be run on a UP machine";
    s_fHdrCharact[F_BYTES_REVERSED_HI] = "Bytes of machine word are reversed.";
}